

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O1

Vec_Str_t *
Bmc_CollapseOneOld(Gia_Man_t *p,int nCubeLim,int nBTLimit,int fCanon,int fReverse,int fVerbose)

{
  char cVar1;
  uint uVar2;
  sat_solver *psVar3;
  int iVar4;
  Cnf_Dat_t *p_00;
  uint *puVar5;
  void *pvVar6;
  undefined8 *puVar7;
  void *pvVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  Vec_Int_t *pVVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  Vec_Str_t *vSop_00;
  uint uVar15;
  int iVar16;
  uint uVar17;
  char *pcVar18;
  uint uVar19;
  size_t sVar20;
  ulong uVar21;
  int i;
  long lVar22;
  bool bVar23;
  int iLit;
  int fComplete [2];
  timespec ts;
  Vec_Str_t *vSop [2];
  sat_solver *pSat [2];
  Vec_Int_t *vLitsC [2];
  sat_solver *pSatClean [2];
  abctime Time [2] [2];
  uint local_12c;
  Vec_Int_t *local_128;
  int local_120;
  uint local_11c;
  ulong local_118;
  Vec_Int_t *local_110;
  Vec_Int_t *local_108;
  uint local_fc;
  long local_f8;
  Vec_Int_t *local_f0;
  int local_e8 [2];
  ulong local_e0;
  timespec local_d8;
  int local_c4;
  int local_c0;
  int local_bc;
  uint *local_b8 [2];
  sat_solver *local_a8 [3];
  uint local_8c;
  uint *local_88 [2];
  sat_solver *local_78 [2];
  Cnf_Dat_t *local_68;
  long local_60;
  long local_58 [4];
  sat_solver *local_38;
  
  uVar17 = p->vCis->nSize;
  pvVar8 = (void *)0x0;
  local_120 = fVerbose;
  local_fc = nCubeLim;
  local_c4 = nBTLimit;
  local_c0 = fCanon;
  local_bc = fReverse;
  p_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,0,0,0);
  local_a8[0] = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  local_a8[1] = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  local_78[0] = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  local_68 = p_00;
  local_78[1] = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  puVar5 = (uint *)malloc(0x10);
  puVar5[0] = 1000;
  puVar5[1] = 0;
  pvVar6 = malloc(1000);
  *(void **)(puVar5 + 2) = pvVar6;
  local_b8[0] = puVar5;
  puVar7 = (undefined8 *)malloc(0x10);
  *puVar7 = 1000;
  pvVar6 = malloc(1000);
  puVar7[1] = pvVar6;
  local_b8[1] = (uint *)puVar7;
  local_88[0] = (uint *)malloc(0x10);
  uVar15 = 0x10;
  if (0xe < uVar17 - 1) {
    uVar15 = uVar17;
  }
  local_88[0][1] = 0;
  *local_88[0] = uVar15;
  lVar14 = (long)(int)uVar15;
  if (uVar15 != 0) {
    pvVar8 = malloc(lVar14 * 4);
  }
  *(void **)(local_88[0] + 2) = pvVar8;
  local_88[1] = (uint *)malloc(0x10);
  local_88[1][1] = 0;
  *local_88[1] = uVar15;
  if (uVar15 == 0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = malloc(lVar14 * 4);
  }
  *(void **)(local_88[1] + 2) = pvVar6;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nSize = 0;
  pVVar9->nCap = uVar15;
  if (uVar15 == 0) {
    piVar10 = (int *)0x0;
  }
  else {
    piVar10 = (int *)malloc(lVar14 * 4);
  }
  pVVar9->pArray = piVar10;
  local_128 = (Vec_Int_t *)malloc(0x10);
  local_128->nSize = 0;
  local_128->nCap = uVar15;
  if (uVar15 == 0) {
    piVar10 = (int *)0x0;
  }
  else {
    piVar10 = (int *)malloc(lVar14 * 4);
  }
  local_128->pArray = piVar10;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  pVVar11->nSize = 0;
  pVVar11->nCap = uVar15;
  if (uVar15 == 0) {
    piVar10 = (int *)0x0;
  }
  else {
    piVar10 = (int *)malloc(lVar14 * 4);
  }
  pVVar11->pArray = piVar10;
  local_f0 = (Vec_Int_t *)malloc(0x10);
  local_f0->nSize = 0;
  local_f0->nCap = uVar15;
  if (uVar15 == 0) {
    piVar10 = (int *)0x0;
  }
  else {
    piVar10 = (int *)malloc(lVar14 << 2);
  }
  local_f0->pArray = piVar10;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_e8[0] = 0;
  local_e8[1] = 0;
  iVar13 = local_68->nVars;
  local_110 = pVVar11;
  if (local_bc == 0) {
    if (0 < (int)uVar17) {
      iVar16 = -uVar17;
      do {
        Vec_IntPush(pVVar9,iVar13 + iVar16);
        iVar16 = iVar16 + 1;
      } while (iVar16 != 0);
    }
  }
  else if (0 < (int)uVar17) {
    iVar16 = uVar17 + 1;
    do {
      iVar13 = iVar13 + -1;
      Vec_IntPush(pVVar9,iVar13);
      iVar16 = iVar16 + -1;
    } while (1 < iVar16);
  }
  local_60 = (long)local_c4;
  lVar14 = 0;
  local_118 = (ulong)uVar17;
  local_108 = pVVar9;
  do {
    local_12c = (uint)lVar14 | 2;
    psVar3 = local_a8[lVar14];
    iVar13 = sat_solver_solve(psVar3,(lit *)&local_12c,(lit *)&local_128,local_60,0,0,0);
    puVar5 = local_b8[0];
    if (iVar13 == -1) {
      local_b8[0][1] = 0;
      pcVar18 = " 1\n";
      if (lVar14 == 0) {
        pcVar18 = " 0\n";
      }
      lVar14 = 0;
      goto LAB_00585964;
    }
    if (iVar13 == 0) {
      uVar15 = (uint)local_118;
      pVVar9 = local_110;
      uVar17 = 0;
      iVar13 = local_120;
      goto LAB_00585a89;
    }
    iVar13 = pVVar9->nSize;
    if (0 < (long)iVar13) {
      piVar10 = local_108->pArray;
      lVar22 = 0;
      do {
        if (piVar10[lVar22] < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        Vec_IntPush((Vec_Int_t *)local_88[lVar14],piVar10[lVar22] * 2 + 1);
        lVar22 = lVar22 + 1;
      } while (iVar13 != lVar22);
    }
    iVar13 = sat_solver_addclause(psVar3,(lit *)&local_12c,(lit *)&local_128);
    if (iVar13 == 0) {
      __assert_fail("status",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                    ,0x38e,"Vec_Str_t *Bmc_CollapseOneOld(Gia_Man_t *, int, int, int, int, int)");
    }
    iVar13 = sat_solver_addclause(local_78[lVar14],(lit *)&local_12c,(lit *)&local_128);
    pVVar9 = local_108;
    if (iVar13 == 0) {
      __assert_fail("status",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                    ,0x390,"Vec_Str_t *Bmc_CollapseOneOld(Gia_Man_t *, int, int, int, int, int)");
    }
    puVar5 = local_b8[lVar14];
    uVar17 = *puVar5;
    if (puVar5[1] == uVar17) {
      if ((int)uVar17 < 0x10) {
        if (*(void **)(puVar5 + 2) == (void *)0x0) {
          pvVar6 = malloc(0x10);
        }
        else {
          pvVar6 = realloc(*(void **)(puVar5 + 2),0x10);
        }
        *(void **)(puVar5 + 2) = pvVar6;
        sVar20 = 0x10;
      }
      else {
        sVar20 = (ulong)uVar17 * 2;
        if ((int)sVar20 <= (int)uVar17) goto LAB_00585356;
        if (*(void **)(puVar5 + 2) == (void *)0x0) {
          pvVar6 = malloc(sVar20);
        }
        else {
          pvVar6 = realloc(*(void **)(puVar5 + 2),sVar20);
        }
        *(void **)(puVar5 + 2) = pvVar6;
      }
      *puVar5 = (uint)sVar20;
    }
LAB_00585356:
    uVar17 = puVar5[1];
    puVar5[1] = uVar17 + 1;
    *(undefined1 *)(*(long *)(puVar5 + 2) + (long)(int)uVar17) = 0;
    bVar23 = lVar14 == 0;
    lVar14 = lVar14 + 1;
  } while (bVar23);
  iVar13 = local_120;
  pVVar9 = local_110;
  if ((int)local_fc < 0) {
    uVar15 = (uint)local_118;
    uVar17 = 0;
  }
  else {
    local_f8 = 0;
    uVar17 = 0;
    uVar12 = local_118;
    do {
      uVar21 = 0;
      local_11c = uVar17;
      do {
        uVar17 = local_11c;
        uVar15 = (uint)uVar12;
        if (iVar13 != 0) {
          iVar16 = clock_gettime(3,&local_d8);
          if (iVar16 < 0) {
            local_f8 = -1;
          }
          else {
            local_f8 = local_d8.tv_nsec / 1000 + local_d8.tv_sec * 1000000;
          }
        }
        psVar3 = local_a8[uVar21];
        if (local_c0 == 0) {
          iVar16 = local_108->nSize;
          if (0 < (long)iVar16) {
            piVar10 = local_108->pArray;
            lVar14 = 0;
            do {
              psVar3->polarity[piVar10[lVar14]] = '\0';
              lVar14 = lVar14 + 1;
            } while (iVar16 != lVar14);
          }
          iVar16 = sat_solver_solve(psVar3,(lit *)0x0,(lit *)0x0,0,0,0,0);
        }
        else {
          puVar5 = local_88[uVar21];
          sat_solver_set_resource_limits(psVar3,local_60,0,0,0);
          uVar17 = local_11c;
          iVar16 = sat_solver_solve_lexsat(psVar3,*(int **)(puVar5 + 2),puVar5[1]);
        }
        if (iVar13 != 0) {
          iVar4 = clock_gettime(3,&local_d8);
          if (iVar4 < 0) {
            lVar14 = -1;
          }
          else {
            lVar14 = local_d8.tv_nsec / 1000 + local_d8.tv_sec * 1000000;
          }
          local_58[uVar21 * 2] = local_58[uVar21 * 2] + (lVar14 - local_f8);
        }
        if (iVar16 == 0) goto LAB_00585a89;
        if (iVar16 == -1) {
          uVar21 = uVar21 & 0xffffffff;
LAB_005858f3:
          local_e8[uVar21] = 1;
          break;
        }
        local_128->nSize = 0;
        pVVar9 = (Vec_Int_t *)local_88[uVar21];
        pVVar9->nSize = 0;
        iVar16 = local_108->nSize;
        local_e0 = uVar21;
        if (0 < (long)iVar16) {
          piVar10 = local_108->pArray;
          psVar3 = local_a8[uVar21];
          lVar14 = 0;
          do {
            iVar4 = piVar10[lVar14];
            if (((long)iVar4 < 0) || (psVar3->size <= iVar4)) {
              __assert_fail("v >= 0 && v < s->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                            ,0xda,"int sat_solver_var_value(sat_solver *, int)");
            }
            local_12c = (uint)(psVar3->model[iVar4] != 1) + iVar4 * 2;
            Vec_IntPush(local_128,local_12c);
            Vec_IntPush(pVVar9,local_12c);
            lVar14 = lVar14 + 1;
          } while (iVar16 != lVar14);
        }
        uVar12 = local_e0;
        pVVar9 = local_110;
        uVar15 = (uint)local_118;
        if (iVar13 != 0) {
          iVar16 = clock_gettime(3,&local_d8);
          if (iVar16 < 0) {
            local_f8 = -1;
          }
          else {
            local_f8 = local_d8.tv_nsec / 1000 + local_d8.tv_sec * 1000000;
          }
        }
        psVar3 = local_a8[uVar12];
        iVar16 = Bmc_CollapseExpand(local_78[uVar12 & 0xffffffff ^ 1],psVar3,local_128,pVVar9,
                                    local_f0,local_c4,local_c0,-1);
        if (iVar13 != 0) {
          iVar4 = clock_gettime(3,&local_d8);
          if (iVar4 < 0) {
            lVar14 = -1;
          }
          else {
            lVar14 = local_d8.tv_nsec / 1000 + local_d8.tv_sec * 1000000;
          }
          local_58[uVar12 * 2 + 1] = local_58[uVar12 * 2 + 1] + (lVar14 - local_f8);
        }
        uVar17 = local_11c;
        if (iVar16 < 0) goto LAB_00585a89;
        local_38 = psVar3;
        puVar5 = local_b8[uVar12];
        uVar17 = puVar5[1];
        if ((int)uVar17 < 1) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                        ,0x249,"char Vec_StrPop(Vec_Str_t *)");
        }
        pvVar6 = *(void **)(puVar5 + 2);
        local_8c = uVar17 - 1;
        puVar5[1] = local_8c;
        uVar19 = uVar15 + uVar17 + 3;
        if ((int)uVar17 <= (int)uVar19) {
          uVar2 = *puVar5;
          sVar20 = (long)(int)uVar2 * 2;
          if ((int)sVar20 < (int)uVar19) {
            if ((int)uVar2 < (int)uVar19) {
              if (pvVar6 == (void *)0x0) {
                pvVar6 = malloc((long)(int)uVar19);
              }
              else {
                pvVar6 = realloc(pvVar6,(long)(int)uVar19);
              }
              sVar20 = (size_t)uVar19;
LAB_00585728:
              *(void **)(puVar5 + 2) = pvVar6;
              *puVar5 = (uint)sVar20;
            }
          }
          else if ((int)uVar2 < (int)sVar20 && (int)uVar2 < (int)uVar19) {
            if (pvVar6 == (void *)0x0) {
              pvVar6 = malloc(sVar20);
            }
            else {
              pvVar6 = realloc(pvVar6,sVar20);
            }
            goto LAB_00585728;
          }
          lVar14 = (long)(int)puVar5[1];
          if ((int)puVar5[1] < (int)uVar19) {
            do {
              *(undefined1 *)(*(long *)(puVar5 + 2) + lVar14) = 0x2d;
              lVar14 = lVar14 + 1;
            } while ((int)uVar19 != lVar14);
          }
          puVar5[1] = uVar19;
        }
        uVar19 = (uVar15 + uVar17) - 1;
        if (((int)uVar19 < 0) || ((int)puVar5[1] <= (int)uVar19)) {
LAB_00585df0:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                        ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
        }
        uVar12 = (ulong)uVar19;
        *(undefined1 *)(*(long *)(puVar5 + 2) + uVar12) = 0x20;
        uVar17 = uVar17 + uVar15;
        if (((int)uVar17 < 0) || ((int)puVar5[1] <= (int)uVar17)) goto LAB_00585df0;
        *(byte *)(*(long *)(puVar5 + 2) + (ulong)uVar17) = local_e0 == 0 | 0x30;
        if ((int)puVar5[1] <= (int)(uVar12 + 2)) goto LAB_00585df0;
        *(undefined1 *)(*(long *)(puVar5 + 2) + uVar12 + 2) = 10;
        if ((int)puVar5[1] <= (int)(uVar12 + 3)) goto LAB_00585df0;
        *(undefined1 *)(*(long *)(puVar5 + 2) + uVar12 + 3) = 0;
        local_f0->nSize = 0;
        iVar13 = pVVar9->nSize;
        if (0 < (long)iVar13) {
          piVar10 = local_110->pArray;
          lVar14 = 0;
          do {
            uVar17 = piVar10[lVar14];
            if (((long)(int)uVar17 < 0) || (local_128->nSize <= (int)uVar17)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            local_12c = local_128->pArray[(int)uVar17];
            if ((int)local_12c < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x131,"int Abc_LitNot(int)");
            }
            Vec_IntPush(local_f0,local_12c ^ 1);
            if (local_bc == 0) {
              if ((int)local_12c < 0) goto LAB_00585e4d;
              uVar17 = uVar17 + local_8c;
            }
            else {
              if ((int)local_12c < 0) {
LAB_00585e4d:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x130,"int Abc_LitIsCompl(int)");
              }
              uVar17 = ~uVar17 + uVar19;
            }
            if (((int)uVar17 < 0) || ((int)puVar5[1] <= (int)uVar17)) goto LAB_00585df0;
            *(byte *)(*(long *)(puVar5 + 2) + (ulong)uVar17) = (byte)local_12c & 1 ^ 0x31;
            lVar14 = lVar14 + 1;
          } while (iVar13 != lVar14);
        }
        iVar16 = sat_solver_addclause(local_38,local_f0->pArray,local_f0->pArray + local_f0->nSize);
        iVar13 = local_120;
        uVar17 = local_11c;
        pVVar9 = local_110;
        uVar12 = local_118;
        if (iVar16 != 1) {
          uVar21 = local_e0;
          if (iVar16 != 0) {
            __assert_fail("status == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                          ,0x3d3,
                          "Vec_Str_t *Bmc_CollapseOneOld(Gia_Man_t *, int, int, int, int, int)");
          }
          goto LAB_005858f3;
        }
        uVar21 = local_e0 + 1;
      } while (local_e0 == 0);
      uVar15 = (uint)uVar12;
    } while ((local_e8[1] == 0 && local_e8[0] == 0) &&
            (uVar17 = uVar17 + 1, (int)uVar17 < (int)local_fc || local_fc == 0));
  }
  goto LAB_00585a89;
LAB_00585964:
  do {
    cVar1 = pcVar18[lVar14];
    uVar17 = *puVar5;
    if (puVar5[1] == uVar17) {
      if ((int)uVar17 < 0x10) {
        if (*(void **)(puVar5 + 2) == (void *)0x0) {
          pvVar6 = malloc(0x10);
        }
        else {
          pvVar6 = realloc(*(void **)(puVar5 + 2),0x10);
        }
        sVar20 = 0x10;
      }
      else {
        sVar20 = (ulong)uVar17 * 2;
        if ((int)sVar20 <= (int)uVar17) goto LAB_005859bd;
        if (*(void **)(puVar5 + 2) == (void *)0x0) {
          pvVar6 = malloc(sVar20);
        }
        else {
          pvVar6 = realloc(*(void **)(puVar5 + 2),sVar20);
        }
      }
      *(void **)(puVar5 + 2) = pvVar6;
      *puVar5 = (uint)sVar20;
    }
LAB_005859bd:
    pVVar9 = local_110;
    iVar13 = local_120;
    uVar17 = puVar5[1];
    puVar5[1] = uVar17 + 1;
    *(char *)(*(long *)(puVar5 + 2) + (long)(int)uVar17) = cVar1;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  uVar17 = *puVar5;
  uVar15 = (uint)local_118;
  if (puVar5[1] == uVar17) {
    if ((int)uVar17 < 0x10) {
      if (*(void **)(puVar5 + 2) == (void *)0x0) {
        pvVar6 = malloc(0x10);
      }
      else {
        pvVar6 = realloc(*(void **)(puVar5 + 2),0x10);
      }
      *(void **)(puVar5 + 2) = pvVar6;
      sVar20 = 0x10;
    }
    else {
      sVar20 = (ulong)uVar17 * 2;
      if ((int)sVar20 <= (int)uVar17) goto LAB_00585a6b;
      if (*(void **)(puVar5 + 2) == (void *)0x0) {
        pvVar6 = malloc(sVar20);
      }
      else {
        pvVar6 = realloc(*(void **)(puVar5 + 2),sVar20);
      }
      *(void **)(puVar5 + 2) = pvVar6;
    }
    *puVar5 = (uint)sVar20;
  }
LAB_00585a6b:
  uVar17 = puVar5[1];
  puVar5[1] = uVar17 + 1;
  *(undefined1 *)(*(long *)(puVar5 + 2) + (long)(int)uVar17) = 0;
  local_e8[0] = 1;
  uVar17 = 0;
LAB_00585a89:
  pVVar11 = local_108;
  if (local_108->pArray != (int *)0x0) {
    free(local_108->pArray);
    pVVar11->pArray = (int *)0x0;
  }
  free(pVVar11);
  if (local_128->pArray != (int *)0x0) {
    free(local_128->pArray);
    local_128->pArray = (int *)0x0;
  }
  free(local_128);
  puVar5 = local_88[0];
  if (*(void **)(local_88[0] + 2) != (void *)0x0) {
    free(*(void **)(local_88[0] + 2));
    puVar5[2] = 0;
    puVar5[3] = 0;
  }
  if (puVar5 != (uint *)0x0) {
    free(puVar5);
  }
  puVar5 = local_88[1];
  if (*(void **)(local_88[1] + 2) != (void *)0x0) {
    free(*(void **)(local_88[1] + 2));
    puVar5[2] = 0;
    puVar5[3] = 0;
  }
  if (puVar5 != (uint *)0x0) {
    free(puVar5);
  }
  if (pVVar9->pArray != (int *)0x0) {
    free(pVVar9->pArray);
    pVVar9->pArray = (int *)0x0;
  }
  free(pVVar9);
  if (local_f0->pArray != (int *)0x0) {
    free(local_f0->pArray);
    local_f0->pArray = (int *)0x0;
  }
  free(local_f0);
  Cnf_DataFree(local_68);
  sat_solver_delete(local_a8[0]);
  sat_solver_delete(local_a8[1]);
  sat_solver_delete(local_78[0]);
  sat_solver_delete(local_78[1]);
  if (local_e8[1] == 0 || local_e8[0] == 0) {
    if (local_e8[0] == 0 && local_e8[1] == 0) {
      vSop_00 = (Vec_Str_t *)0x0;
    }
    else {
      vSop_00 = (Vec_Str_t *)local_b8[local_e8[1]];
      local_b8[local_e8[1]] = (uint *)0x0;
      if (1 < uVar17) {
        Bmc_CollapseIrredundantFull(vSop_00,vSop_00->nSize / (int)(uVar15 + 3),uVar15);
      }
    }
    if (iVar13 != 0) {
      printf("Processed output with %d supp vars. ",(ulong)uVar15);
      if (vSop_00 == (Vec_Str_t *)0x0) {
        pcVar18 = "The resulting SOP exceeded %d cubes.\n";
        uVar12 = (ulong)local_fc;
      }
      else {
        pcVar18 = "The best cover contains %d cubes.\n";
        uVar12 = (long)vSop_00->nSize / (long)(int)(uVar15 + 3) & 0xffffffff;
      }
      printf(pcVar18,uVar12);
      local_128 = (Vec_Int_t *)(double)local_58[0];
      iVar13 = (int)pcVar18;
      Abc_Print(iVar13,"%s =","Onset  minterm");
      Abc_Print(iVar13,"%9.2f sec\n",SUB84((double)local_128 / 1000000.0,0));
      local_128 = (Vec_Int_t *)(double)local_58[1];
      Abc_Print(iVar13,"%s =","Onset  expand ");
      Abc_Print(iVar13,"%9.2f sec\n",SUB84((double)local_128 / 1000000.0,0));
      local_128 = (Vec_Int_t *)(double)local_58[2];
      Abc_Print(iVar13,"%s =","Offset minterm");
      Abc_Print(iVar13,"%9.2f sec\n",SUB84((double)local_128 / 1000000.0,0));
      local_128 = (Vec_Int_t *)(double)local_58[3];
      Abc_Print(iVar13,"%s =","Offset expand ");
      Abc_Print(iVar13,"%9.2f sec\n",SUB84((double)local_128 / 1000000.0,0));
    }
    puVar5 = local_b8[0];
    if (local_b8[0] != (uint *)0x0) {
      if (*(void **)(local_b8[0] + 2) != (void *)0x0) {
        free(*(void **)(local_b8[0] + 2));
        puVar5[2] = 0;
        puVar5[3] = 0;
      }
      free(puVar5);
      local_b8[0] = (uint *)0x0;
    }
    puVar5 = local_b8[1];
    if (local_b8[1] != (uint *)0x0) {
      if (*(void **)((long)local_b8[1] + 8) != (void *)0x0) {
        free(*(void **)((long)local_b8[1] + 8));
        *(undefined8 *)((long)puVar5 + 8) = 0;
      }
      free(puVar5);
    }
    return vSop_00;
  }
  __assert_fail("!fComplete[0] || !fComplete[1]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                ,0x3e4,"Vec_Str_t *Bmc_CollapseOneOld(Gia_Man_t *, int, int, int, int, int)");
}

Assistant:

Vec_Str_t * Bmc_CollapseOneOld( Gia_Man_t * p, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose )
{
    int fVeryVerbose = fVerbose;
    int nVars = Gia_ManCiNum(p);
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8, 0, 0, 0, 0 );
    sat_solver * pSat[2]      = { (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0), (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0) };
    sat_solver * pSatClean[2] = { (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0), (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0) };
    Vec_Str_t * vSop[2]   = { Vec_StrAlloc(1000),  Vec_StrAlloc(1000)  }, * vRes = NULL;
    Vec_Int_t * vLitsC[2] = { Vec_IntAlloc(nVars), Vec_IntAlloc(nVars) };
    Vec_Int_t * vVars = Vec_IntAlloc( nVars );
    Vec_Int_t * vLits = Vec_IntAlloc( nVars );
    Vec_Int_t * vNums = Vec_IntAlloc( nVars );
    Vec_Int_t * vCube = Vec_IntAlloc( nVars );
    int n, v, iVar, iLit, iCiVarBeg, iCube = 0, Start, status;
    abctime clk = 0, Time[2][2] = {{0}};
    int fComplete[2] = {0};

    // collect CI variables
    iCiVarBeg = pCnf->nVars - nVars;// - 1;
    if ( fReverse )
        for ( v = nVars - 1; v >= 0; v-- )
            Vec_IntPush( vVars, iCiVarBeg + v );
    else
        for ( v = 0; v < nVars; v++ )
            Vec_IntPush( vVars, iCiVarBeg + v );

    // check that on-set/off-set is sat
    for ( n = 0; n < 2; n++ )
    {
        iLit = Abc_Var2Lit( 1, n ); // n=0 => F=1   n=1 => F=0
        status = sat_solver_solve( pSat[n], &iLit, &iLit + 1, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            goto cleanup; // timeout
        if ( status == l_False )
        {
            Vec_StrClear( vSop[0] );
            Vec_StrPrintStr( vSop[0], n ? " 1\n" : " 0\n" );
            Vec_StrPush( vSop[0], '\0' );
            fComplete[0] = 1;
            goto cleanup; // const0/1
        }
        // start with all negative literals
        Vec_IntForEachEntry( vVars, iVar, v )
            Vec_IntPush( vLitsC[n], Abc_Var2Lit(iVar, 1) );
        // add literals to the solver
        status = sat_solver_addclause( pSat[n], &iLit, &iLit + 1 );
        assert( status );
        status = sat_solver_addclause( pSatClean[n], &iLit, &iLit + 1 );
        assert( status );
        // start cover
        Vec_StrPush( vSop[n], '\0' );
    }

    // compute cube pairs
    for ( iCube = 0; nCubeLim == 0 || iCube < nCubeLim; iCube++ )
    {
        for ( n = 0; n < 2; n++ )
        {
            if ( fVeryVerbose ) clk = Abc_Clock();
            // get the assignment
            if ( fCanon )
                status = Bmc_ComputeCanonical( pSat[n], vLitsC[n], vCube, nBTLimit );
            else
            {
                sat_solver_clean_polarity( pSat[n], Vec_IntArray(vVars), Vec_IntSize(vVars) );
                status = sat_solver_solve( pSat[n], NULL, NULL, 0, 0, 0, 0 );
            }
            if ( fVeryVerbose ) Time[n][0] += Abc_Clock() - clk;
            if ( status == l_Undef )
                goto cleanup; // timeout
            if ( status == l_False )
            {
                fComplete[n] = 1;
                break;
            }
            // collect values
            Vec_IntClear( vLits );
            Vec_IntClear( vLitsC[n] );
            Vec_IntForEachEntry( vVars, iVar, v )
            {
                iLit = Abc_Var2Lit(iVar, !sat_solver_var_value(pSat[n], iVar));
                Vec_IntPush( vLits, iLit );
                Vec_IntPush( vLitsC[n], iLit );
            }
            // expand the values
            if ( fVeryVerbose ) clk = Abc_Clock();
            status = Bmc_CollapseExpand( pSatClean[!n], pSat[n], vLits, vNums, vCube, nBTLimit, fCanon, -1 );
            if ( fVeryVerbose ) Time[n][1] += Abc_Clock() - clk;
            if ( status < 0 )
                goto cleanup; // timeout
            // collect cube
            Vec_StrPop( vSop[n] );
            Start = Vec_StrSize( vSop[n] );
            Vec_StrFillExtra( vSop[n], Start + nVars + 4, '-' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 0, ' ' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 1, (char)(n ? '0' : '1') );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 2, '\n' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 3, '\0' );
            Vec_IntClear( vCube );
            Vec_IntForEachEntry( vNums, iVar, v )
            {
                iLit = Vec_IntEntry( vLits, iVar );
                Vec_IntPush( vCube, Abc_LitNot(iLit) );
                if ( fReverse )
                    Vec_StrWriteEntry( vSop[n], Start + nVars - iVar - 1, (char)('0' + !Abc_LitIsCompl(iLit)) );
                else 
                    Vec_StrWriteEntry( vSop[n], Start + iVar, (char)('0' + !Abc_LitIsCompl(iLit)) );
            }
            // add cube
            status = sat_solver_addclause( pSat[n], Vec_IntArray(vCube), Vec_IntLimit(vCube) );
            if ( status == 0 )
            {
                fComplete[n] = 1;
                break;
            }
            assert( status == 1 );
        }
        if ( fComplete[0] || fComplete[1] )
            break;
    }
cleanup:
    Vec_IntFree( vVars );
    Vec_IntFree( vLits );
    Vec_IntFree( vLitsC[0] );
    Vec_IntFree( vLitsC[1] );
    Vec_IntFree( vNums );
    Vec_IntFree( vCube );
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat[0] );
    sat_solver_delete( pSat[1] );
    sat_solver_delete( pSatClean[0] );
    sat_solver_delete( pSatClean[1] );
    assert( !fComplete[0] || !fComplete[1] );
    if ( fComplete[0] || fComplete[1] ) // one of the cover is computed
    {
        vRes = vSop[fComplete[1]]; vSop[fComplete[1]] = NULL;
        if ( iCube > 1 )
//            Bmc_CollapseIrredundant( vRes, Vec_StrSize(vRes)/(nVars +3), nVars );
            Bmc_CollapseIrredundantFull( vRes, Vec_StrSize(vRes)/(nVars +3), nVars );
    }
    if ( fVeryVerbose )
    {
        int fProfile = 0;
        printf( "Processed output with %d supp vars. ", nVars );
        if ( vRes == NULL )
            printf( "The resulting SOP exceeded %d cubes.\n", nCubeLim );
        else 
            printf( "The best cover contains %d cubes.\n", Vec_StrSize(vRes)/(nVars +3) );
        Abc_PrintTime( 1, "Onset  minterm", Time[0][0] );
        Abc_PrintTime( 1, "Onset  expand ", Time[0][1] );
        Abc_PrintTime( 1, "Offset minterm", Time[1][0] );
        Abc_PrintTime( 1, "Offset expand ", Time[1][1] );
        if ( fProfile )
        {
            Abc_PrintTime( 1, "Expand check1 ", clkCheck1 ); clkCheck1 = 0;
            Abc_PrintTime( 1, "Expand check2 ", clkCheck2 ); clkCheck2 = 0;
            Abc_PrintTime( 1, "Expand sat    ", clkCheckS ); clkCheckS = 0;
            Abc_PrintTime( 1, "Expand unsat  ", clkCheckU ); clkCheckU = 0;
        }
    }
    Vec_StrFreeP( &vSop[0] );
    Vec_StrFreeP( &vSop[1] );
    return vRes;
}